

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int init_reg_rules_alloc(Dwarf_Debug dbg,Dwarf_Frame_s *f,Dwarf_Unsigned count,Dwarf_Error *error)

{
  Dwarf_Reg_Rule_s *pDVar1;
  Dwarf_Error *error_local;
  Dwarf_Unsigned count_local;
  Dwarf_Frame_s *f_local;
  Dwarf_Debug dbg_local;
  
  f->fr_reg_count = count;
  pDVar1 = (Dwarf_Reg_Rule_s *)calloc(count,0x40);
  f->fr_reg = pDVar1;
  if (f->fr_reg == (Dwarf_Reg_Rule_s *)0x0) {
    if (error != (Dwarf_Error *)0x0) {
      _dwarf_error(dbg,error,0xc0);
    }
    dbg_local._4_4_ = 1;
  }
  else {
    _dwarf_init_reg_rules_ru(f->fr_reg,0,count,dbg->de_frame_rule_initial_value);
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

static int
init_reg_rules_alloc(Dwarf_Debug dbg,struct Dwarf_Frame_s *f,
    Dwarf_Unsigned count, Dwarf_Error * error)
{
    f->fr_reg_count = count;
    f->fr_reg = (struct Dwarf_Reg_Rule_s *)
        calloc((size_t)count, sizeof(struct Dwarf_Reg_Rule_s));
    if (f->fr_reg == 0) {
        if (error) {
            _dwarf_error(dbg, error, DW_DLE_DF_ALLOC_FAIL);
        }
        return DW_DLV_ERROR;
    }
    _dwarf_init_reg_rules_ru(f->fr_reg,0, count,
        dbg->de_frame_rule_initial_value);
    return DW_DLV_OK;
}